

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

ssize_t __thiscall kj::Executor::send(Executor *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  bool *pbVar2;
  ssize_t extraout_RAX;
  Executor *other;
  Impl *pIVar3;
  State *pSVar4;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  XThreadEvent *this_00;
  long *in_FS_OFFSET;
  byte local_141;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_130;
  XThreadEvent *local_120;
  EventPort *local_118;
  EventPort *p;
  EventPort *_p1313;
  EventLoop *local_100;
  EventLoop *l;
  EventLoop *_l1303;
  EventLoop *loop;
  undefined1 local_e0 [8];
  Locked<kj::Executor::Impl::State> lock;
  Fault f_1;
  undefined1 local_c0 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>_&,_const_kj::None_&>
  _kjCondition_1;
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> promiseNode;
  undefined1 local_7a [10];
  EventLoop *thisThread;
  Fault local_60;
  Fault f;
  Type *local_50;
  undefined1 local_48 [8];
  DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
  _kjCondition;
  bool sync_local;
  XThreadEvent *event_local;
  Executor *this_local;
  
  this_00 = (XThreadEvent *)CONCAT44(in_register_00000034,__fd);
  _kjCondition._39_1_ = (byte)__buf & 1;
  local_50 = (Type *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this_00->state);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<kj::_::XThreadEvent::{unnamed_type#1}&>::operator==
            ((DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
              *)local_48,(DebugExpression<kj::_::XThreadEvent::_unnamed_type_1_&> *)&local_50,
             (Type *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::XThreadEvent::_unnamed_type_1_&,_unnamed_type_1_>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x4fc,FAILED,"event.state == _::XThreadEvent::UNUSED","_kjCondition,",
               (DebugComparison<kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)_&,_kj::_::XThreadEvent::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1865:3)>
                *)local_48);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  if ((_kjCondition._39_1_ & 1) == 0) {
    other = getCurrentThreadExecutor();
    Maybe<const_kj::Executor_&>::operator=(&this_00->replyExecutor,other);
  }
  else {
    local_7a._2_8_ = *(long *)(*in_FS_OFFSET + -0x20);
    promiseNode.ptr.ptr._7_1_ = 0;
    local_141 = 0;
    if ((XThreadEvent *)local_7a._2_8_ != (XThreadEvent *)0x0) {
      Maybe<kj::Own<kj::Executor,_std::nullptr_t>_>::
      map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1281:34)>
                ((Maybe<kj::Own<kj::Executor,_std::nullptr_t>_> *)local_7a,
                 (anon_class_8_1_8991fb9c *)
                 &(((XThreadEvent *)local_7a._2_8_)->super_Event).location.function);
      promiseNode.ptr.ptr._7_1_ = 1;
      promiseNode.ptr.ptr._6_1_ = 0;
      pbVar2 = Maybe<bool>::orDefault
                         ((Maybe<bool> *)local_7a,(bool *)((long)&promiseNode.ptr.ptr + 6));
      local_141 = *pbVar2;
    }
    if ((promiseNode.ptr.ptr._7_1_ & 1) != 0) {
      Maybe<bool>::~Maybe((Maybe<bool> *)local_7a);
    }
    if ((local_141 & 1) != 0) {
      (*(this_00->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])();
      f_1.exception =
           (Exception *)
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                      &_kjCondition_1.result);
      kj::_::DebugExpression<kj::Maybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&>::
      operator==((DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>_&,_const_kj::None_&>
                  *)local_c0,
                 (DebugExpression<kj::Maybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&> *)
                 &f_1,(None *)&kj::none);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
      if (bVar1) {
        Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::~Maybe
                  ((Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)
                   &_kjCondition_1.result);
        return extraout_RAX;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&,kj::None_const&>&,char_const(&)[84]>
                ((Fault *)&lock.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x509,FAILED,"promiseNode == kj::none",
                 "_kjCondition,\"can\'t call executeSync() on own thread\'s executor with a promise-returning function\""
                 ,(DebugComparison<kj::Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>_&,_const_kj::None_&>
                   *)local_c0,
                 (char (*) [84])
                 "can\'t call executeSync() on own thread\'s executor with a promise-returning function"
                );
      kj::_::Debug::Fault::fatal((Fault *)&lock.ptr);
    }
  }
  pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&this->impl);
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)local_e0,pIVar3);
  pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                     ((Locked<kj::Executor::Impl::State> *)local_e0);
  l = kj::_::readMaybe<kj::EventLoop>(&pSVar4->loop);
  if (l == (EventLoop *)0x0) {
    kj::_::XThreadEvent::setDisconnected(this_00);
    _p1313._4_4_ = 1;
  }
  else {
    this_00->state = QUEUED;
    local_100 = l;
    _l1303 = l;
    pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_e0);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::add(&pSVar4->start,this_00);
    p = kj::_::readMaybe<kj::EventPort>(&_l1303->port);
    if (p != (EventPort *)0x0) {
      local_118 = p;
      (*p->_vptr_EventPort[3])();
    }
    if ((_kjCondition._39_1_ & 1) != 0) {
      local_120 = this_00;
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_130);
      Locked<kj::Executor::Impl::State>::
      wait<kj::Executor::send(kj::_::XThreadEvent&,bool)const::__1>
                ((Locked<kj::Executor::Impl::State> *)local_e0,&local_120,&local_130);
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_130);
    }
    _p1313._4_4_ = 0;
  }
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_e0);
  return extraout_RAX_00;
}

Assistant:

void Executor::send(_::XThreadEvent& event, bool sync) const {
  KJ_ASSERT(event.state == _::XThreadEvent::UNUSED);

  if (sync) {
    EventLoop* thisThread = threadLocalEventLoop;
    if (thisThread != nullptr &&
        thisThread->executor.map([this](auto& e) { return e == this; }).orDefault(false)) {
      // Invoking a sync request on our own thread. Just execute it directly; if we try to queue
      // it to the loop, we'll deadlock.
      auto promiseNode = event.execute();

      // If the function returns a promise, we have no way to pump the event loop to wait for it,
      // because the event loop may already be pumping somewhere up the stack.
      KJ_ASSERT(promiseNode == kj::none,
          "can't call executeSync() on own thread's executor with a promise-returning function");

      return;
    }
  } else {
    event.replyExecutor = getCurrentThreadExecutor();

    // Note that async requests will "just work" even if the target executor is our own thread's
    // executor. In theory we could detect this case to avoid some locking and signals but that
    // would be extra code complexity for probably little benefit.
  }

  auto lock = impl->state.lockExclusive();
  const EventLoop* loop;
  KJ_IF_SOME(l, lock->loop) {
    loop = &l;
  } else {
    event.setDisconnected();
    return;
  }